

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void clearbykeys(global_State *g,GCObject *l)

{
  ulong uVar1;
  int iVar2;
  Table *h;
  GCObject *o;
  ulong uVar3;
  
  if (l != (GCObject *)0x0) {
    do {
      if (l->field_0xb != 0x1f) {
        uVar3 = *(ulong *)&l[1].tt;
        uVar1 = uVar3 + (long)(1 << (l->field_0xb & 0x1f)) * 0x18;
        do {
          if ((*(byte *)(uVar3 + 9) & 0x40) == 0) {
            o = (GCObject *)0x0;
          }
          else {
            o = *(GCObject **)(uVar3 + 0x10);
          }
          iVar2 = iscleared(g,o);
          if (iVar2 == 0) {
            if ((*(byte *)(uVar3 + 8) & 0xf) == 0) goto LAB_0010d348;
          }
          else {
            *(undefined1 *)(uVar3 + 8) = 0x10;
LAB_0010d348:
            if ((*(byte *)(uVar3 + 9) & 0x40) != 0) {
              *(undefined1 *)(uVar3 + 9) = 0xb;
            }
          }
          uVar3 = uVar3 + 0x18;
        } while (uVar3 < uVar1);
      }
      l = l[3].next;
    } while (l != (GCObject *)0x0);
  }
  return;
}

Assistant:

static void clearbykeys (global_State *g, GCObject *l) {
  for (; l; l = gco2t(l)->gclist) {
    Table *h = gco2t(l);
    Node *limit = gnodelast(h);
    Node *n;
    for (n = gnode(h, 0); n < limit; n++) {
      if (iscleared(g, gckeyN(n)))  /* unmarked key? */
        setempty(gval(n));  /* remove entry */
      if (isempty(gval(n)))  /* is entry empty? */
        clearkey(n);  /* clear its key */
    }
  }
}